

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool sentencepiece::string_util::lexical_cast<bool>(string_view arg,bool *result)

{
  undefined1 *in_RDX;
  size_t i;
  string lower_value;
  char *kFalse [5];
  char *kTrue [5];
  char *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  ulong local_d8;
  allocator<char> *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_99;
  string local_98 [32];
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined1 *local_20;
  byte local_1;
  
  local_28 = "yes";
  local_38 = "true";
  pcStack_30 = "y";
  local_48 = "1";
  pcStack_40 = "t";
  local_58 = "no";
  local_68 = "false";
  pcStack_60 = "n";
  local_78 = "0";
  pcStack_70 = "f";
  __first._M_current = (char *)&local_99;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::~allocator(&local_99);
  __result._M_current = (char *)local_98;
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,in_stack_ffffffffffffff10,__result,
             (_func_int_int *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
  local_d8 = 0;
  do {
    if (4 < local_d8) {
      local_1 = 0;
LAB_0040532a:
      std::__cxx11::string::~string(local_98);
      return (bool)(local_1 & 1);
    }
    in_stack_ffffffffffffff07 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                         in_stack_fffffffffffffef8);
    if ((bool)in_stack_ffffffffffffff07) {
      *local_20 = 1;
      local_1 = 1;
      goto LAB_0040532a;
    }
    in_stack_ffffffffffffff06 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                         in_stack_fffffffffffffef8);
    if ((bool)in_stack_ffffffffffffff06) {
      *local_20 = 0;
      local_1 = 1;
      goto LAB_0040532a;
    }
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

inline bool lexical_cast(absl::string_view arg, bool *result) {
  const char *kTrue[] = {"1", "t", "true", "y", "yes"};
  const char *kFalse[] = {"0", "f", "false", "n", "no"};
  std::string lower_value = std::string(arg);
  std::transform(lower_value.begin(), lower_value.end(), lower_value.begin(),
                 ::tolower);
  for (size_t i = 0; i < 5; ++i) {
    if (lower_value == kTrue[i]) {
      *result = true;
      return true;
    } else if (lower_value == kFalse[i]) {
      *result = false;
      return true;
    }
  }

  return false;
}